

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void lzham::vector<lzham::adaptive_bit_model>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  adaptive_bit_model *in_RSI;
  adaptive_bit_model *in_RDI;
  adaptive_bit_model *pDst;
  adaptive_bit_model *pSrc_end;
  adaptive_bit_model *pSrc;
  adaptive_bit_model *local_30;
  adaptive_bit_model *local_20;
  
  local_30 = in_RDI;
  for (local_20 = in_RSI; local_20 != in_RSI + in_EDX; local_20 = local_20 + 1) {
    adaptive_bit_model::adaptive_bit_model(local_30,local_20);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }